

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::TagAliasRegistry::add(TagAliasRegistry *this,char *alias,char *tag,SourceLineInfo *lineInfo)

{
  bool bVar1;
  byte bVar2;
  ostream *poVar3;
  domain_error *pdVar4;
  char *pcVar5;
  char *in_RDX;
  char *in_RSI;
  long *in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<const_char_*,_TagAlias>_>::value,_pair<iterator,_bool>_>
  _Var6;
  ostringstream oss_1;
  ostringstream oss;
  SourceLineInfo *in_stack_fffffffffffff978;
  TagAlias *in_stack_fffffffffffff980;
  pair<const_char_*,_Catch::TagAlias> *in_stack_fffffffffffff988;
  SourceLineInfo *in_stack_fffffffffffff990;
  string *in_stack_fffffffffffff998;
  TagAlias *in_stack_fffffffffffff9a0;
  string *in_stack_fffffffffffff9b0;
  string *in_stack_fffffffffffff9b8;
  string *in_stack_fffffffffffff9c0;
  string *in_stack_fffffffffffff9c8;
  ostringstream *this_00;
  byte local_5b2;
  allocator local_561;
  string local_560 [32];
  Option<Catch::TagAlias> local_540;
  ostringstream local_4f0 [376];
  _Base_ptr local_378;
  byte local_370;
  allocator local_339;
  string local_338 [184];
  _Base_ptr local_280;
  byte local_278;
  undefined1 local_269;
  ostringstream local_248 [381];
  byte local_cb;
  byte local_ca;
  allocator local_c9;
  string local_c8 [37];
  byte local_a3;
  byte local_a2;
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [40];
  char *local_18;
  char *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  local_a2 = 0;
  local_a3 = 0;
  local_ca = 0;
  local_cb = 0;
  std::__cxx11::string::string(local_40,in_RSI,&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"[@",&local_79);
  bVar1 = startsWith(in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0);
  pcVar5 = local_10;
  local_5b2 = 1;
  if (bVar1) {
    std::allocator<char>::allocator();
    local_a2 = 1;
    std::__cxx11::string::string(local_a0,pcVar5,&local_a1);
    local_a3 = 1;
    std::allocator<char>::allocator();
    local_ca = 1;
    std::__cxx11::string::string(local_c8,"]",&local_c9);
    local_cb = 1;
    bVar1 = endsWith(in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
    local_5b2 = bVar1 ^ 0xff;
  }
  if ((local_cb & 1) != 0) {
    std::__cxx11::string::~string(local_c8);
  }
  if ((local_ca & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  }
  if ((local_a3 & 1) != 0) {
    std::__cxx11::string::~string(local_a0);
  }
  if ((local_a2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  }
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  if ((local_5b2 & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_248);
    poVar3 = std::operator<<((ostream *)local_248,"error: tag alias, \"");
    poVar3 = std::operator<<(poVar3,local_10);
    std::operator<<(poVar3,"\" is not of the form [@alias name].\n");
    Catch::operator<<((ostream *)in_stack_fffffffffffff980,in_stack_fffffffffffff978);
    local_269 = 1;
    pdVar4 = (domain_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    std::domain_error::domain_error(pdVar4,pcVar5);
    local_269 = 0;
    __cxa_throw(pdVar4,&std::domain_error::typeinfo,std::domain_error::~domain_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_338,local_18,&local_339);
  SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)in_stack_fffffffffffff980,in_stack_fffffffffffff978);
  TagAlias::TagAlias(in_stack_fffffffffffff9a0,in_stack_fffffffffffff998,in_stack_fffffffffffff990);
  std::make_pair<char_const*&,Catch::TagAlias>
            (&in_stack_fffffffffffff988->first,in_stack_fffffffffffff980);
  _Var6 = std::
          map<std::__cxx11::string,Catch::TagAlias,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagAlias>>>
          ::insert<std::pair<char_const*,Catch::TagAlias>>
                    ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>_>
                      *)in_stack_fffffffffffff990,in_stack_fffffffffffff988);
  local_378 = (_Base_ptr)_Var6.first._M_node;
  local_370 = _Var6.second;
  bVar2 = local_370 ^ 0xff;
  local_280 = local_378;
  local_278 = local_370;
  std::pair<const_char_*,_Catch::TagAlias>::~pair((pair<const_char_*,_Catch::TagAlias> *)0x19fd79);
  TagAlias::~TagAlias(in_stack_fffffffffffff980);
  SourceLineInfo::~SourceLineInfo((SourceLineInfo *)0x19fd93);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator((allocator<char> *)&local_339);
  if ((bVar2 & 1) != 0) {
    this_00 = local_4f0;
    std::__cxx11::ostringstream::ostringstream(this_00);
    poVar3 = std::operator<<((ostream *)this_00,"error: tag alias, \"");
    poVar3 = std::operator<<(poVar3,local_10);
    poVar3 = std::operator<<(poVar3,"\" already registered.\n");
    std::operator<<(poVar3,"\tFirst seen at ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_560,local_10,&local_561);
    (**(code **)(*in_RDI + 0x10))(&local_540,in_RDI,local_560);
    Option<Catch::TagAlias>::operator->(&local_540);
    poVar3 = Catch::operator<<((ostream *)in_stack_fffffffffffff980,in_stack_fffffffffffff978);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tRedefined at ");
    Catch::operator<<(poVar3,in_stack_fffffffffffff978);
    Option<Catch::TagAlias>::~Option((Option<Catch::TagAlias> *)0x19ff07);
    std::__cxx11::string::~string(local_560);
    std::allocator<char>::~allocator((allocator<char> *)&local_561);
    pdVar4 = (domain_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    std::domain_error::domain_error(pdVar4,pcVar5);
    __cxa_throw(pdVar4,&std::domain_error::typeinfo,std::domain_error::~domain_error);
  }
  return;
}

Assistant:

void TagAliasRegistry::add( char const* alias, char const* tag, SourceLineInfo const& lineInfo ) {

        if( !startsWith( alias, "[@" ) || !endsWith( alias, "]" ) ) {
            std::ostringstream oss;
            oss << "error: tag alias, \"" << alias << "\" is not of the form [@alias name].\n" << lineInfo;
            throw std::domain_error( oss.str().c_str() );
        }
        if( !m_registry.insert( std::make_pair( alias, TagAlias( tag, lineInfo ) ) ).second ) {
            std::ostringstream oss;
            oss << "error: tag alias, \"" << alias << "\" already registered.\n"
                << "\tFirst seen at " << find(alias)->lineInfo << "\n"
                << "\tRedefined at " << lineInfo;
            throw std::domain_error( oss.str().c_str() );
        }
    }